

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::VarExpr<(wabt::ExprType)17>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)17>_>_>
 __thiscall
wabt::MakeUnique<wabt::VarExpr<(wabt::ExprType)17>,wabt::Var,wabt::Location&>
          (wabt *this,Var *args,Location *args_1)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x88);
  puVar4[1] = 0;
  puVar4[2] = 0;
  *puVar4 = &PTR__Expr_0155b510;
  sVar1 = (args_1->filename).size_;
  sVar2 = (args_1->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args_1->field_1 + 8);
  puVar4[3] = (args_1->filename).data_;
  puVar4[4] = sVar1;
  puVar4[5] = sVar2;
  puVar4[6] = uVar3;
  *(undefined4 *)(puVar4 + 7) = 0x11;
  *puVar4 = &PTR__VarExpr_0155ba18;
  Var::Var((Var *)(puVar4 + 8),args);
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)17>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)17>_>,_true,_true>
          )(__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)17>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)17>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}